

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIEnvironment::clearDeletionQueue(CGUIEnvironment *this)

{
  array<irr::gui::IGUIElement_*> *paVar1;
  _func_int *p_Var2;
  pointer ppIVar3;
  IGUIElement *pIVar4;
  _func_int *p_Var5;
  pointer ppIVar6;
  ulong uVar7;
  
  ppIVar6 = (this->DeletionQueue).m_data.
            super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar3 = (this->DeletionQueue).m_data.
            super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar6 != ppIVar3) {
    paVar1 = &this->DeletionQueue;
    if ((int)((ulong)((long)ppIVar3 - (long)ppIVar6) >> 3) != 0) {
      uVar7 = 0;
      do {
        (*(ppIVar6[uVar7]->super_IEventReceiver)._vptr_IEventReceiver[9])();
        ppIVar6 = (paVar1->m_data).
                  super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar4 = ppIVar6[uVar7];
        p_Var5 = (pIVar4->super_IEventReceiver)._vptr_IEventReceiver[-3];
        p_Var2 = (_func_int *)
                 ((long)&(pIVar4->Children).
                         super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                         ._M_impl._M_node.super__List_node_base._M_prev + (long)p_Var5);
        *(int *)p_Var2 = *(int *)p_Var2 + -1;
        if (*(int *)p_Var2 == 0) {
          p_Var5 = (_func_int *)
                   ((long)&(pIVar4->super_IEventReceiver)._vptr_IEventReceiver + (long)p_Var5);
          (**(code **)(*(long *)p_Var5 + 8))(p_Var5);
          ppIVar6 = (paVar1->m_data).
                    super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < ((ulong)((long)(this->DeletionQueue).m_data.
                                      super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar6) >>
                        3 & 0xffffffff));
    }
    ppIVar3 = (this->DeletionQueue).m_data.
              super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (paVar1->m_data).
    super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->DeletionQueue).m_data.
    super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->DeletionQueue).m_data.
    super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppIVar6 != (pointer)0x0) {
      operator_delete(ppIVar6,(long)ppIVar3 - (long)ppIVar6);
    }
    (this->DeletionQueue).is_sorted = true;
  }
  return;
}

Assistant:

void CGUIEnvironment::clearDeletionQueue()
{
	if (DeletionQueue.empty())
		return;

	for (u32 i = 0; i < DeletionQueue.size(); ++i) {
		DeletionQueue[i]->remove();
		DeletionQueue[i]->drop();
	}

	DeletionQueue.clear();
}